

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Column *col)

{
  bool bVar1;
  bool bVar2;
  ostream *in_RDI;
  string line;
  iterator __end3;
  iterator __begin3;
  Column *__range3;
  bool first;
  iterator *in_stack_ffffffffffffff48;
  iterator *in_stack_ffffffffffffff50;
  Column *in_stack_ffffffffffffff60;
  iterator *in_stack_ffffffffffffff70;
  iterator *in_stack_ffffffffffffff98;
  
  bVar1 = true;
  Column::begin((Column *)in_stack_ffffffffffffff50);
  Column::end(in_stack_ffffffffffffff60);
  while( true ) {
    bVar2 = Column::iterator::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar2) break;
    Column::iterator::operator*[abi_cxx11_(in_stack_ffffffffffffff98);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<(in_RDI,"\n");
    }
    ::std::operator<<(in_RDI,(string *)&stack0xffffffffffffff60);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    Column::iterator::operator++(in_stack_ffffffffffffff70);
  }
  return (ostream *)in_RDI;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Column const& col) {
		bool first = true;
		for (auto line : col) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}